

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_unknown_chunk_location
               (png_const_structrp png_ptr,png_inforp info_ptr,int chunk,int location)

{
  png_byte pVar1;
  int local_20;
  int location_local;
  int chunk_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) && (-1 < chunk)) &&
     (chunk < info_ptr->unknown_chunks_num)) {
    local_20 = location;
    if ((location & 0xbU) == 0) {
      png_app_error(png_ptr,"invalid unknown chunk location");
      if ((location & 4U) == 0) {
        local_20 = 1;
      }
      else {
        local_20 = 8;
      }
    }
    pVar1 = check_location(png_ptr,local_20);
    info_ptr->unknown_chunks[chunk].location = pVar1;
  }
  return;
}

Assistant:

void PNGAPI
png_set_unknown_chunk_location(png_const_structrp png_ptr, png_inforp info_ptr,
    int chunk, int location)
{
   /* This API is pretty pointless in 1.6.0 because the location can be set
    * before the call to png_set_unknown_chunks.
    *
    * TODO: add a png_app_warning in 1.7
    */
   if (png_ptr != NULL && info_ptr != NULL && chunk >= 0 &&
      chunk < info_ptr->unknown_chunks_num)
   {
      if ((location & (PNG_HAVE_IHDR|PNG_HAVE_PLTE|PNG_AFTER_IDAT)) == 0)
      {
         png_app_error(png_ptr, "invalid unknown chunk location");
         /* Fake out the pre 1.6.0 behavior: */
         if (((unsigned int)location & PNG_HAVE_IDAT) != 0) /* undocumented! */
            location = PNG_AFTER_IDAT;

         else
            location = PNG_HAVE_IHDR; /* also undocumented */
      }

      info_ptr->unknown_chunks[chunk].location =
         check_location(png_ptr, location);
   }
}